

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O0

void Cof_ManPrintHighFanoutOne(Cof_Man_t *p,Cof_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  Cof_Obj_t *local_18;
  Cof_Obj_t *pObj_local;
  Cof_Man_t *p_local;
  
  local_18 = pObj;
  pObj_local = (Cof_Obj_t *)p;
  printf("%7d : ",(ulong)(uint)pObj->Id);
  uVar1 = Cof_ObjFaninNum(local_18);
  uVar2 = Cof_ObjFanoutNum(local_18);
  printf("i/o/c =%2d %5d %5d  ",(ulong)uVar1,(ulong)uVar2,(ulong)(local_18->nFanoutsM << 1));
  uVar1 = Cof_ObjLevel((Cof_Man_t *)pObj_local,local_18);
  printf("l =%4d  ",(ulong)uVar1);
  uVar1 = Cof_ManSuppSize((Cof_Man_t *)pObj_local,&local_18,1);
  printf("s =%5d  ",(ulong)uVar1);
  uVar1 = Cof_ManTfiSize((Cof_Man_t *)pObj_local,&local_18,1);
  printf("TFI =%7d  ",(ulong)uVar1);
  uVar1 = Cof_ManTfoSize((Cof_Man_t *)pObj_local,&local_18,1);
  printf("TFO =%7d  ",(ulong)uVar1);
  uVar1 = Cof_ManCountRemoved((Cof_Man_t *)pObj_local,local_18,0);
  printf("C0 =%6d  ",(ulong)uVar1);
  uVar1 = Cof_ManCountRemoved((Cof_Man_t *)pObj_local,local_18,1);
  printf("C1 =%6d",(ulong)uVar1);
  printf("\n");
  return;
}

Assistant:

void Cof_ManPrintHighFanoutOne( Cof_Man_t * p, Cof_Obj_t * pObj )
{
    printf( "%7d : ",     pObj->Id );
    printf( "i/o/c =%2d %5d %5d  ",  Cof_ObjFaninNum(pObj), Cof_ObjFanoutNum(pObj), 2*pObj->nFanoutsM );
    printf( "l =%4d  ",   Cof_ObjLevel(p, pObj) );
    printf( "s =%5d  ",   Cof_ManSuppSize(p, &pObj, 1) );
    printf( "TFI =%7d  ", Cof_ManTfiSize(p, &pObj, 1) );
    printf( "TFO =%7d  ", Cof_ManTfoSize(p, &pObj, 1) );
    printf( "C0 =%6d  ",  Cof_ManCountRemoved(p, pObj, 0) );
    printf( "C1 =%6d",    Cof_ManCountRemoved(p, pObj, 1) );
    printf( "\n" );
}